

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O3

function * getMainFunc(vm *v)

{
  module *pmVar1;
  int iVar2;
  function *pfVar3;
  ulong uVar4;
  uint32 *puVar5;
  
  pmVar1 = v->m;
  if ((pmVar1->start_sec).start_segment_count == 1) {
    puVar5 = (pmVar1->start_sec).start_segment_addr;
LAB_00104ce5:
    if ((ulong)*puVar5 != 0xffffffff) {
      pfVar3 = (function *)(*(v->func).get_ele)(&v->func,(ulong)*puVar5);
      return pfVar3;
    }
  }
  else {
    uVar4 = (ulong)(pmVar1->export_sec).export_segment_count;
    if (uVar4 != 0) {
      puVar5 = &(((pmVar1->export_sec).export_segment_addr)->ex_desc).index;
      do {
        if (((export_desc *)(puVar5 + -1))->tag == '\0') {
          iVar2 = strcmp(*(char **)(puVar5 + -3),"main");
          if (iVar2 == 0) goto LAB_00104ce5;
        }
        puVar5 = puVar5 + 4;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
  }
  return (function *)0x0;
}

Assistant:

function *getMainFunc(vm *v) {
    function_index f_index = -1;
    module *m = v->m;
    if (m->start_sec.start_segment_count == 1) {
        /*获取启动段的启动函数的索引*/
        f_index = *(m->start_sec.start_segment_addr);
    } else {
        for (int i = 0; i < m->export_sec.export_segment_count; ++i) {
            export_pointer ep = m->export_sec.export_segment_addr + i;
            if (ep->ex_desc.tag == func_im_export_tag && !strcmp((const char *) ep->name, "main")) {
                f_index = ep->ex_desc.index;
                break;
            }
        }
    }
    function *f = NULL;
    if (f_index != -1)
        f = v->func.get_ele(&v->func, f_index);
    return f;
}